

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

int prvTidytmbstrncasecmp(ctmbstr s1,ctmbstr s2,uint n)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    cVar1 = s1[lVar5];
    uVar2 = prvTidyToLower((int)cVar1);
    uVar3 = prvTidyToLower((int)s2[lVar5]);
    if (uVar2 != uVar3) {
      iVar4 = 0;
      if (n != (uint)lVar5) {
        iVar4 = (uint)(s2[lVar5] < s1[lVar5]) * 2 + -1;
      }
      return iVar4;
    }
    if (cVar1 == '\0') break;
    if (n == (uint)lVar5) {
      return 0;
    }
    lVar5 = lVar5 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrncasecmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}